

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O3

char * irafgetc(char *irafheader,int offset,int nc)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  
  pcVar1 = (char *)calloc((ulong)(nc + 1),1);
  if (pcVar1 == (char *)0x0) {
    ffpmsg("IRAFGETC Cannot allocate memory for string variable");
  }
  else if (0 < nc) {
    uVar2 = 0;
    do {
      cVar3 = ' ';
      if (0x1e < (byte)(irafheader[uVar2 + (long)offset] - 1U)) {
        cVar3 = irafheader[uVar2 + (long)offset];
      }
      pcVar1[uVar2] = cVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nc != uVar2);
  }
  return pcVar1;
}

Assistant:

static char *irafgetc (

char	*irafheader,	/* IRAF image header */
int	offset,		/* Number of bytes to skip before string */
int	nc)		/* Maximum number of characters in string */

{
    char *ctemp, *cheader;
    int i;

    cheader = irafheader;
    ctemp = (char *) calloc (nc+1, 1);
    if (ctemp == NULL) {
	ffpmsg("IRAFGETC Cannot allocate memory for string variable");
	return (NULL);
	}
    for (i = 0; i < nc; i++) {
	ctemp[i] = cheader[offset+i];
	if (ctemp[i] > 0 && ctemp[i] < 32)
	    ctemp[i] = ' ';
	}

    return (ctemp);
}